

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesize.cpp
# Opt level: O0

void __thiscall
QPageSizePrivate::QPageSizePrivate
          (QPageSizePrivate *this,int windowsId,QSize *pointSize,QString *name)

{
  bool bVar1;
  QSize *in_RCX;
  QSize *in_RDX;
  int in_ESI;
  QPageSizePrivate *in_RDI;
  QSize *unaff_retaddr;
  SizeMatchPolicy in_stack_0000000c;
  QSize *in_stack_00000010;
  PageSizeId id;
  PageSizeId local_24;
  int in_stack_fffffffffffffff0;
  
  QSharedData::QSharedData((QSharedData *)0x550e7a);
  QString::QString((QString *)0x550e88);
  in_RDI->m_id = Custom;
  QSize::QSize((QSize *)in_RDI);
  QString::QString((QString *)0x550eab);
  in_RDI->m_windowsId = 0;
  QSizeF::QSizeF(&in_RDI->m_size);
  in_RDI->m_units = Point;
  if ((0 < in_ESI) && (bVar1 = QSize::isValid(in_RCX), bVar1)) {
    local_24 = qt_idForWindowsID(in_stack_fffffffffffffff0,in_RDX);
    if (local_24 == Custom) {
      local_24 = qt_idForPointSize(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    }
    if (local_24 == Custom) {
      init(in_RDI,(EVP_PKEY_CTX *)in_RDX);
    }
    else {
      init(in_RDI,(EVP_PKEY_CTX *)(ulong)local_24);
    }
    in_RDI->m_windowsId = in_ESI;
  }
  return;
}

Assistant:

QPageSizePrivate::QPageSizePrivate(int windowsId, const QSize &pointSize, const QString &name)
    : m_id(QPageSize::Custom),
      m_windowsId(0),
      m_units(QPageSize::Point)
{
    if (windowsId > 0 && pointSize.isValid()) {
        QPageSize::PageSizeId id = qt_idForWindowsID(windowsId, nullptr);
        // If not a known Windows ID, check if size is a standard PPD size
        if (id == QPageSize::Custom)
            id = qt_idForPointSize(pointSize, QPageSize::FuzzyMatch, nullptr);
        id == QPageSize::Custom ? init(pointSize, name) : init(id, name);
        m_windowsId = windowsId;
    }
}